

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

floatx80 propagateFloatx80NaN_riscv64(floatx80 a,floatx80 b,float_status *status)

{
  FloatClass a_cls;
  int iVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  FloatClass b_cls;
  bool bVar7;
  floatx80 fVar8;
  
  uVar3 = b.low;
  uVar5 = a.low;
  uVar4 = (ulong)b._8_4_;
  a_cls = float_class_normal;
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
      (~a._8_4_ & 0x7fff) == 0) {
    a_cls = (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0
            || ((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0
            ) ^ float_class_snan;
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
      (~b._8_4_ & 0x7fff) != 0) {
    b_cls = float_class_normal;
    bVar7 = true;
    if (a_cls == float_class_snan) goto LAB_00a7ce48;
  }
  else {
    bVar2 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0 &&
            ((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0;
    bVar7 = a_cls == float_class_snan;
    b_cls = float_class_snan;
    if (bVar7) {
      b_cls = bVar2 + float_class_qnan;
    }
    if (bVar2 || bVar7) {
LAB_00a7ce48:
      status->float_exception_flags = status->float_exception_flags | 1;
      goto LAB_00a7ce51;
    }
    b_cls = float_class_qnan;
  }
  bVar7 = false;
LAB_00a7ce51:
  if (status->default_nan_mode == '\0') {
    if (uVar5 < uVar3) {
      bVar2 = false;
    }
    else {
      bVar2 = true;
      if (uVar5 <= uVar3) {
        bVar2 = a.high < b.high;
      }
    }
    iVar1 = pickNaN(a_cls,b_cls,bVar2);
    if (iVar1 == 0) {
      uVar6 = uVar5 | 0xc000000000000000;
      if (!bVar7) {
        uVar6 = uVar5;
      }
      uVar4 = (ulong)a._8_4_;
    }
    else {
      uVar6 = uVar3 | 0xc000000000000000;
      if (b_cls != float_class_snan) {
        uVar6 = uVar3;
      }
    }
  }
  else {
    uVar4 = CONCAT62((uint6)b._10_2_,0xffff);
    uVar6 = 0xc000000000000000;
  }
  fVar8._8_8_ = uVar4;
  fVar8.low = uVar6;
  return fVar8;
}

Assistant:

floatx80 propagateFloatx80NaN(floatx80 a, floatx80 b, float_status *status)
{
    flag aIsLargerSignificand;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!floatx80_is_any_nan(a)
             ? float_class_normal
             : floatx80_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!floatx80_is_any_nan(b)
             ? float_class_normal
             : floatx80_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    if (a.low < b.low) {
        aIsLargerSignificand = 0;
    } else if (b.low < a.low) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (a.high < b.high) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return floatx80_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return floatx80_silence_nan(a, status);
        }
        return a;
    }
}